

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::LogMessage::LogMessageData::LogMessageData
          (LogMessageData *this,Nonnull<const_char_*> file,int line,LogSeverity severity,
          Time timestamp)

{
  long lVar1;
  bool bVar2;
  _Ios_Fmtflags __fmtfl;
  LogSeverity LVar3;
  pid_t pVar4;
  char *extraout_RDX;
  string_view filepath;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  string_view local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60 [2];
  LogSeverity local_40;
  int local_3c;
  LogSeverity severity_local;
  int line_local;
  Nonnull<const_char_*> file_local;
  LogMessageData *this_local;
  uint32_t local_20;
  HiRep local_18;
  Time timestamp_local;
  
  local_20 = timestamp.rep_.rep_lo_;
  this_local = (LogMessageData *)timestamp.rep_.rep_hi_;
  local_40 = severity;
  local_3c = line;
  _severity_local = file;
  file_local = (Nonnull<const_char_*>)this;
  local_18 = (HiRep)this_local;
  timestamp_local.rep_.rep_hi_.lo_ = local_20;
  LogEntry::LogEntry(&this->entry);
  InlinedVector<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
  ::InlinedVector(&this->extra_sinks);
  this->extra_sinks_only = false;
  std::ostream::ostream(&this->manipulated,(streambuf *)0x0);
  Span<char>::Span(&this->encoded_remaining_actual_do_not_use_directly);
  lVar1 = *(long *)(*(long *)&this->manipulated + -0x18);
  __fmtfl = std::operator|(_S_showbase,_S_boolalpha);
  std::ios_base::setf((ios_base *)(&this->manipulated + lVar1),__fmtfl);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_60,_severity_local)
  ;
  (this->entry).full_filename_._M_len = local_60[0]._M_len;
  (this->entry).full_filename_._M_str = local_60[0]._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_80,_severity_local);
  filepath._M_str = extraout_RDX;
  filepath._M_len = (size_t)local_80._M_str;
  local_70 = anon_unknown_4::Basename((anon_unknown_4 *)local_80._M_len,filepath);
  (this->entry).base_filename_ = local_70;
  (this->entry).line_ = local_3c;
  bVar2 = ShouldPrependLogPrefix();
  (this->entry).prefix_ = bVar2;
  LVar3 = NormalizeLogSeverity(local_40);
  (this->entry).severity_ = LVar3;
  (this->entry).verbose_level_ = -1;
  (this->entry).timestamp_.rep_.rep_lo_ = timestamp_local.rep_.rep_hi_.lo_;
  (this->entry).timestamp_.rep_.rep_hi_ = local_18;
  pVar4 = base_internal::GetCachedTID();
  (this->entry).tid_ = pVar4;
  return;
}

Assistant:

LogMessage::LogMessageData::LogMessageData(absl::Nonnull<const char*> file,
                                           int line, absl::LogSeverity severity,
                                           absl::Time timestamp)
    : extra_sinks_only(false), manipulated(nullptr) {
  // Legacy defaults for LOG's ostream:
  manipulated.setf(std::ios_base::showbase | std::ios_base::boolalpha);
  entry.full_filename_ = file;
  entry.base_filename_ = Basename(file);
  entry.line_ = line;
  entry.prefix_ = absl::ShouldPrependLogPrefix();
  entry.severity_ = absl::NormalizeLogSeverity(severity);
  entry.verbose_level_ = absl::LogEntry::kNoVerbosityLevel;
  entry.timestamp_ = timestamp;
  entry.tid_ = absl::base_internal::GetCachedTID();
}